

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

int __thiscall ON_Brep::NextNonsingularTrim(ON_Brep *this,int tid)

{
  TYPE TVar1;
  ON_BrepTrim *pOVar2;
  uint ti;
  
  if ((-1 < tid) &&
     (tid < (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count))
  {
    pOVar2 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
    TVar1 = pOVar2[(uint)tid].m_type;
    ti = NextTrim(this,tid);
    do {
      if ((int)ti < 0) {
        return ti;
      }
      if (pOVar2[ti].m_type != singular) {
        return ti;
      }
      ti = NextTrim(this,ti);
    } while ((ti != tid) || (TVar1 != singular));
  }
  return -1;
}

Assistant:

int ON_Brep::NextNonsingularTrim(int tid) const

{
  if (tid >= m_T.Count() || tid < 0)
    return -1;
  bool bSing =  (m_T[tid].m_type == ON_BrepTrim::singular) ? true : false;
  int ntid;
  ntid = NextTrim(tid);
  while (ntid >=0 && m_T[ntid].m_type == ON_BrepTrim::singular){
    ntid = NextTrim(ntid);
    if (ntid == tid && bSing)
      return -1;
  }
  return ntid;
}